

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biquad_filter.c
# Opt level: O0

int biquad_reinit(biquad_filter_segment_data *data)

{
  biquad_filter_segment_data *data_local;
  
  switch(data->type) {
  case MIXED_LOWPASS:
    biquad_lowpass(data->samplerate,data->frequency,data->Q,&data->data_2);
    break;
  case MIXED_HIGHPASS:
    biquad_highpass(data->samplerate,data->frequency,data->Q,&data->data_2);
    break;
  case MIXED_BANDPASS:
    biquad_bandpass(data->samplerate,data->frequency,data->Q,&data->data_2);
    break;
  case MIXED_NOTCH:
    biquad_notch(data->samplerate,data->frequency,data->Q,&data->data_2);
    break;
  case MIXED_PEAKING:
    biquad_peaking(data->samplerate,data->frequency,data->Q,data->gain,&data->data_2);
    break;
  case MIXED_ALLPASS:
    biquad_allpass(data->samplerate,data->frequency,data->Q,&data->data_2);
    break;
  case MIXED_LOWSHELF:
    biquad_lowshelf(data->samplerate,data->frequency,data->Q,data->gain,&data->data_2);
    break;
  case MIXED_HIGHSHELF:
    biquad_highshelf(data->samplerate,data->frequency,data->Q,data->gain,&data->data_2);
    break;
  default:
    mixed_err(8);
    return 0;
  }
  return 1;
}

Assistant:

static int biquad_reinit(struct biquad_filter_segment_data *data){
  switch(data->type){
  case MIXED_LOWPASS: biquad_lowpass(data->samplerate, data->frequency, data->Q, &data->data_2); break;
  case MIXED_HIGHPASS: biquad_highpass(data->samplerate, data->frequency, data->Q, &data->data_2); break;
  case MIXED_BANDPASS: biquad_bandpass(data->samplerate, data->frequency, data->Q, &data->data_2); break;
  case MIXED_NOTCH: biquad_notch(data->samplerate, data->frequency, data->Q, &data->data_2); break;
  case MIXED_PEAKING: biquad_peaking(data->samplerate, data->frequency, data->Q, data->gain, &data->data_2); break;
  case MIXED_ALLPASS: biquad_allpass(data->samplerate, data->frequency, data->Q, &data->data_2); break;
  case MIXED_LOWSHELF: biquad_lowshelf(data->samplerate, data->frequency, data->Q, data->gain, &data->data_2); break;
  case MIXED_HIGHSHELF: biquad_highshelf(data->samplerate, data->frequency, data->Q, data->gain, &data->data_2); break;
  default:
    mixed_err(MIXED_INVALID_VALUE);
    return 0;
  }
  return 1;
}